

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O3

void png_set_quantize(png_structrp png_ptr,png_colorp palette,int num_palette,int maximum_colors,
                     png_const_uint_16p histogram,int full_quantize)

{
  png_bytep *pppVar1;
  byte bVar2;
  long *plVar3;
  undefined8 *puVar4;
  bool bVar5;
  png_byte pVar6;
  png_byte pVar7;
  png_byte pVar8;
  png_bytep ppVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  png_voidp pvVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  byte bVar20;
  long *ptr;
  long lVar21;
  png_byte pVar22;
  uint uVar23;
  png_colorp ppVar24;
  png_colorp ppVar25;
  byte *pbVar26;
  ulong uVar27;
  byte bVar28;
  uint uVar29;
  int iVar30;
  byte bVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  png_byte *ppVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  png_byte *ppVar41;
  png_color tmp_color;
  uint local_78;
  long local_60;
  
  uVar17 = (ulong)(uint)num_palette;
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if ((png_ptr->flags & 0x40) != 0) {
    png_app_error(png_ptr,"invalid after png_start_read_image or png_read_update_info");
    return;
  }
  png_ptr->flags = png_ptr->flags | 0x4000;
  *(byte *)&png_ptr->transformations = (byte)png_ptr->transformations | 0x40;
  if (full_quantize == 0) {
    ppVar9 = (png_bytep)png_malloc(png_ptr,(ulong)(uint)num_palette);
    png_ptr->quantize_index = ppVar9;
    if (0 < num_palette) {
      uVar10 = 0;
      do {
        png_ptr->quantize_index[uVar10] = (png_byte)uVar10;
        uVar10 = uVar10 + 1;
      } while ((uint)num_palette != uVar10);
    }
  }
  if (maximum_colors < num_palette) {
    uVar10 = (ulong)(uint)num_palette;
    ppVar9 = (png_bytep)png_malloc(png_ptr,uVar10);
    if (histogram == (png_const_uint_16p)0x0) {
      png_ptr->index_to_palette = ppVar9;
      ppVar9 = (png_bytep)png_malloc(png_ptr,uVar10);
      png_ptr->palette_to_index = ppVar9;
      if (0 < num_palette) {
        uVar11 = 0;
        do {
          png_ptr->index_to_palette[uVar11] = (png_byte)uVar11;
          png_ptr->palette_to_index[uVar11] = (png_byte)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      pppVar1 = &png_ptr->index_to_palette;
      pvVar13 = png_calloc(png_ptr,0x1808);
      local_78 = 0x60;
      local_60 = 0x61;
      puVar12 = (undefined8 *)0x0;
LAB_002c4b08:
      iVar30 = 1;
      if (1 < (int)uVar17) {
        iVar30 = (int)uVar17;
      }
      uVar27 = 1;
      uVar11 = 0;
      ppVar41 = &palette[1].blue;
LAB_002c4b37:
      if (uVar11 != iVar30 - 1) goto code_r0x002c4b40;
      if (puVar12 != (undefined8 *)0x0) {
        lVar38 = 0;
        do {
          for (puVar4 = *(undefined8 **)((long)pvVar13 + lVar38 * 8); puVar4 != (undefined8 *)0x0;
              puVar4 = (undefined8 *)*puVar4) {
            ppVar9 = *pppVar1;
            bVar31 = *(byte *)(puVar4 + 1);
            uVar14 = (uint)uVar17;
            if (((int)(uint)ppVar9[bVar31] < (int)uVar14) &&
               (bVar28 = *(byte *)((long)puVar4 + 9), ppVar9[bVar28] < uVar14)) {
              bVar20 = bVar31;
              if ((uVar17 & 1) == 0) {
                bVar20 = bVar28;
              }
              uVar14 = uVar14 - 1;
              uVar11 = (ulong)uVar14;
              bVar2 = ppVar9[bVar20];
              palette[bVar2].blue = palette[uVar11].blue;
              pVar22 = palette[uVar11].green;
              palette[bVar2].red = palette[uVar11].red;
              palette[bVar2].green = pVar22;
              if (0 < num_palette && full_quantize == 0) {
                if ((uVar17 & 1) == 0) {
                  bVar28 = bVar31;
                }
                uVar17 = 0;
                do {
                  ppVar9 = png_ptr->quantize_index;
                  bVar31 = ppVar9[uVar17];
                  if (bVar31 == png_ptr->index_to_palette[bVar20]) {
                    ppVar9[uVar17] = png_ptr->index_to_palette[bVar28];
                    ppVar9 = png_ptr->quantize_index;
                    bVar31 = ppVar9[uVar17];
                  }
                  if (uVar14 == bVar31) {
                    ppVar9[uVar17] = (*pppVar1)[bVar20];
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar10 != uVar17);
                ppVar9 = *pppVar1;
              }
              ppVar9[png_ptr->palette_to_index[uVar11]] = ppVar9[bVar20];
              png_ptr->palette_to_index[png_ptr->index_to_palette[bVar20]] =
                   png_ptr->palette_to_index[uVar11];
              png_ptr->index_to_palette[bVar20] = (png_byte)uVar14;
              png_ptr->palette_to_index[uVar11] = bVar20;
              uVar17 = uVar11;
            }
            if ((int)uVar17 <= maximum_colors) goto LAB_002c4c3d;
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 != local_60);
        goto LAB_002c4c3d;
      }
      goto LAB_002c4e11;
    }
    png_ptr->quantize_sort = ppVar9;
    if (0 < num_palette) {
      uVar11 = 0;
      do {
        png_ptr->quantize_sort[uVar11] = (png_byte)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    iVar30 = 1;
    if (1 < maximum_colors) {
      iVar30 = maximum_colors;
    }
    uVar14 = num_palette - 1;
    iVar18 = num_palette;
    do {
      if (iVar18 <= iVar30) break;
      iVar18 = iVar18 + -1;
      bVar5 = true;
      uVar11 = 0;
      do {
        ppVar9 = png_ptr->quantize_sort;
        bVar31 = ppVar9[uVar11];
        if (histogram[bVar31] < histogram[ppVar9[uVar11 + 1]]) {
          ppVar9[uVar11] = ppVar9[uVar11 + 1];
          png_ptr->quantize_sort[uVar11 + 1] = bVar31;
          bVar5 = false;
        }
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
      uVar14 = uVar14 - 1;
    } while (!bVar5);
    if (full_quantize == 0) {
      if (0 < maximum_colors) {
        uVar17 = 0;
        iVar30 = num_palette;
        do {
          if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[uVar17]) {
            lVar38 = (long)iVar30;
            ppVar24 = palette + iVar30;
            do {
              ppVar25 = ppVar24;
              lVar21 = lVar38 + -1;
              iVar30 = iVar30 + -1;
              ppVar24 = ppVar25 + -1;
              lVar37 = lVar38 + -1;
              lVar38 = lVar21;
            } while ((byte)maximum_colors <= png_ptr->quantize_sort[lVar37]);
            pVar22 = ppVar25[-1].blue;
            pVar7 = ppVar24->red;
            pVar8 = ppVar24->green;
            ppVar25[-1].blue = palette[uVar17].blue;
            pVar6 = palette[uVar17].green;
            ppVar24->red = palette[uVar17].red;
            ppVar24->green = pVar6;
            palette[uVar17].red = pVar7;
            palette[uVar17].green = pVar8;
            palette[uVar17].blue = pVar22;
            png_ptr->quantize_index[lVar21] = (png_byte)uVar17;
            png_ptr->quantize_index[uVar17] = (png_byte)iVar30;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != (uint)maximum_colors);
      }
      if (0 < num_palette) {
        uVar17 = 0;
        do {
          bVar31 = png_ptr->quantize_index[uVar17];
          if (maximum_colors <= (int)(uint)bVar31) {
            uVar11 = 0;
            pVar22 = '\0';
            if (1 < maximum_colors) {
              iVar18 = (uint)palette[bVar31].green - (uint)palette->green;
              iVar30 = -iVar18;
              if (0 < iVar18) {
                iVar30 = iVar18;
              }
              iVar34 = (uint)palette[bVar31].red - (uint)palette->red;
              iVar18 = -iVar34;
              if (0 < iVar34) {
                iVar18 = iVar34;
              }
              iVar35 = (uint)palette[bVar31].blue - (uint)palette->blue;
              iVar34 = -iVar35;
              if (0 < iVar35) {
                iVar34 = iVar35;
              }
              iVar34 = iVar34 + iVar18 + iVar30;
              uVar27 = 1;
              ppVar41 = &palette[1].blue;
              do {
                iVar18 = (uint)palette[bVar31].red - (uint)((png_color *)(ppVar41 + -2))->red;
                iVar30 = -iVar18;
                if (0 < iVar18) {
                  iVar30 = iVar18;
                }
                iVar35 = (uint)palette[bVar31].green - (uint)ppVar41[-1];
                iVar18 = -iVar35;
                if (0 < iVar35) {
                  iVar18 = iVar35;
                }
                iVar32 = (uint)palette[bVar31].blue - (uint)*ppVar41;
                iVar35 = -iVar32;
                if (0 < iVar32) {
                  iVar35 = iVar32;
                }
                iVar35 = iVar35 + iVar18 + iVar30;
                if (iVar35 < iVar34) {
                  uVar11 = uVar27 & 0xffffffff;
                  iVar34 = iVar35;
                }
                pVar22 = (png_byte)uVar11;
                uVar27 = uVar27 + 1;
                ppVar41 = ppVar41 + 3;
              } while ((uint)maximum_colors != uVar27);
            }
            png_ptr->quantize_index[uVar17] = pVar22;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar10);
      }
    }
    else if (0 < maximum_colors) {
      ppVar9 = png_ptr->quantize_sort;
      uVar10 = 0;
      do {
        if (maximum_colors <= (int)(uint)ppVar9[uVar10]) {
          ppVar24 = palette + (int)uVar17;
          pbVar26 = ppVar9 + (long)(int)uVar17 + -1;
          do {
            ppVar25 = ppVar24;
            uVar17 = (ulong)((int)uVar17 - 1);
            ppVar24 = ppVar25 + -1;
            bVar31 = *pbVar26;
            pbVar26 = pbVar26 + -1;
          } while ((byte)maximum_colors <= bVar31);
          palette[uVar10].blue = ppVar25[-1].blue;
          pVar22 = ppVar24->green;
          palette[uVar10].red = ppVar24->red;
          palette[uVar10].green = pVar22;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)maximum_colors);
    }
    png_free(png_ptr,png_ptr->quantize_sort);
    png_ptr->quantize_sort = (png_bytep)0x0;
    num_palette = maximum_colors;
  }
LAB_002c502c:
  if (png_ptr->palette == (png_colorp)0x0) {
    png_ptr->palette = palette;
  }
  png_ptr->num_palette = (png_uint_16)num_palette;
  if (full_quantize == 0) {
    return;
  }
  ppVar9 = (png_bytep)png_calloc(png_ptr,0x8000);
  png_ptr->palette_lookup = ppVar9;
  pvVar13 = png_malloc(png_ptr,0x8000);
  memset(pvVar13,0xff,0x8000);
  if (0 < num_palette) {
    uVar17 = 0;
    do {
      bVar31 = palette[uVar17].red >> 3;
      uVar14 = (uint)(palette[uVar17].green >> 3);
      uVar23 = (uint)(palette[uVar17].blue >> 3);
      lVar38 = 0;
      uVar10 = 0;
      do {
        uVar15 = (uint)bVar31 - (int)uVar10;
        if (bVar31 < uVar10) {
          uVar15 = (int)uVar10 - (uint)bVar31;
        }
        uVar11 = 0;
        lVar37 = lVar38;
        do {
          uVar16 = uVar14 - (int)uVar11;
          if (uVar14 < uVar11) {
            uVar16 = (int)uVar11 - uVar14;
          }
          uVar33 = uVar16;
          if ((int)uVar16 < (int)uVar15) {
            uVar33 = uVar15;
          }
          uVar27 = 0;
          uVar19 = uVar23;
          do {
            uVar29 = (int)uVar27 - uVar23;
            if (uVar27 <= uVar23) {
              uVar29 = uVar19;
            }
            uVar39 = uVar29;
            if ((int)uVar29 < (int)uVar33) {
              uVar39 = uVar33;
            }
            iVar30 = uVar29 + uVar15 + uVar16 + uVar39;
            if (iVar30 < (int)(uint)*(byte *)((long)pvVar13 + uVar27 + lVar37)) {
              *(char *)((long)pvVar13 + uVar27 + lVar37) = (char)iVar30;
              png_ptr->palette_lookup[uVar27 + lVar37] = (png_byte)uVar17;
            }
            uVar27 = uVar27 + 1;
            uVar19 = uVar19 - 1;
          } while (uVar27 != 0x20);
          uVar11 = uVar11 + 1;
          lVar37 = lVar37 + 0x20;
        } while (uVar11 != 0x20);
        uVar10 = uVar10 + 1;
        lVar38 = lVar38 + 0x400;
      } while (uVar10 != 0x20);
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)num_palette);
  }
  png_free(png_ptr,pvVar13);
  return;
code_r0x002c4b40:
  ppVar24 = palette + uVar11;
  ppVar36 = ppVar41;
  uVar40 = uVar27;
  do {
    uVar23 = (uint)ppVar24->red - (uint)((png_color *)(ppVar36 + -2))->red;
    uVar14 = -uVar23;
    if (0 < (int)uVar23) {
      uVar14 = uVar23;
    }
    uVar15 = (uint)ppVar24->green - (uint)ppVar36[-1];
    uVar23 = -uVar15;
    if (0 < (int)uVar15) {
      uVar23 = uVar15;
    }
    uVar16 = (uint)ppVar24->blue - (uint)*ppVar36;
    uVar15 = -uVar16;
    if (0 < (int)uVar16) {
      uVar15 = uVar16;
    }
    uVar14 = (uVar15 & 0xff) + (uVar23 & 0xff) + (uVar14 & 0xff);
    if (uVar14 <= local_78) {
      puVar12 = (undefined8 *)png_malloc_warn(png_ptr,0x10);
      if (puVar12 == (undefined8 *)0x0) {
        puVar12 = (undefined8 *)0x0;
        goto LAB_002c4c3d;
      }
      *puVar12 = *(undefined8 *)((long)pvVar13 + (ulong)uVar14 * 8);
      *(char *)(puVar12 + 1) = (char)uVar11;
      *(char *)((long)puVar12 + 9) = (char)uVar40;
      *(undefined8 **)((long)pvVar13 + (ulong)uVar14 * 8) = puVar12;
    }
    uVar40 = uVar40 + 1;
    ppVar36 = ppVar36 + 3;
  } while (uVar17 != uVar40);
  uVar27 = uVar27 + 1;
  ppVar41 = ppVar41 + 3;
  uVar11 = uVar11 + 1;
  if (puVar12 == (undefined8 *)0x0) goto LAB_002c4e11;
  goto LAB_002c4b37;
LAB_002c4e11:
  puVar12 = (undefined8 *)0x0;
LAB_002c4c3d:
  lVar38 = 0;
  do {
    ptr = *(long **)((long)pvVar13 + lVar38 * 8);
    if (ptr != (long *)0x0) {
      do {
        plVar3 = (long *)*ptr;
        png_free(png_ptr,ptr);
        ptr = plVar3;
      } while (plVar3 != (long *)0x0);
      puVar12 = (undefined8 *)0x0;
    }
    *(undefined8 *)((long)pvVar13 + lVar38 * 8) = 0;
    lVar38 = lVar38 + 1;
  } while (lVar38 != 0x301);
  local_78 = local_78 + 0x60;
  local_60 = local_60 + 0x60;
  if ((int)uVar17 <= maximum_colors) goto LAB_002c4e20;
  goto LAB_002c4b08;
LAB_002c4e20:
  png_free(png_ptr,pvVar13);
  png_free(png_ptr,png_ptr->palette_to_index);
  png_free(png_ptr,png_ptr->index_to_palette);
  *pppVar1 = (png_bytep)0x0;
  png_ptr->palette_to_index = (png_bytep)0x0;
  num_palette = maximum_colors;
  goto LAB_002c502c;
}

Assistant:

void PNGAPI
png_set_quantize(png_structrp png_ptr, png_colorp palette,
    int num_palette, int maximum_colors, png_const_uint_16p histogram,
    int full_quantize)
{
   png_debug(1, "in png_set_quantize");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   png_ptr->transformations |= PNG_QUANTIZE;

   if (full_quantize == 0)
   {
      int i;

      png_ptr->quantize_index = (png_bytep)png_malloc(png_ptr,
          (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));
      for (i = 0; i < num_palette; i++)
         png_ptr->quantize_index[i] = (png_byte)i;
   }

   if (num_palette > maximum_colors)
   {
      if (histogram != NULL)
      {
         /* This is easy enough, just throw out the least used colors.
          * Perhaps not the best solution, but good enough.
          */

         int i;

         /* Initialize an array to sort colors */
         png_ptr->quantize_sort = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));

         /* Initialize the quantize_sort array */
         for (i = 0; i < num_palette; i++)
            png_ptr->quantize_sort[i] = (png_byte)i;

         /* Find the least used palette entries by starting a
          * bubble sort, and running it until we have sorted
          * out enough colors.  Note that we don't care about
          * sorting all the colors, just finding which are
          * least used.
          */

         for (i = num_palette - 1; i >= maximum_colors; i--)
         {
            int done; /* To stop early if the list is pre-sorted */
            int j;

            done = 1;
            for (j = 0; j < i; j++)
            {
               if (histogram[png_ptr->quantize_sort[j]]
                   < histogram[png_ptr->quantize_sort[j + 1]])
               {
                  png_byte t;

                  t = png_ptr->quantize_sort[j];
                  png_ptr->quantize_sort[j] = png_ptr->quantize_sort[j + 1];
                  png_ptr->quantize_sort[j + 1] = t;
                  done = 0;
               }
            }

            if (done != 0)
               break;
         }

         /* Swap the palette around, and set up a table, if necessary */
         if (full_quantize != 0)
         {
            int j = num_palette;

            /* Put all the useful colors within the max, but don't
             * move the others.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  palette[i] = palette[j];
               }
            }
         }
         else
         {
            int j = num_palette;

            /* Move all the used colors inside the max limit, and
             * develop a translation table.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               /* Only move the colors we need to */
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  png_color tmp_color;

                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  tmp_color = palette[j];
                  palette[j] = palette[i];
                  palette[i] = tmp_color;
                  /* Indicate where the color went */
                  png_ptr->quantize_index[j] = (png_byte)i;
                  png_ptr->quantize_index[i] = (png_byte)j;
               }
            }

            /* Find closest color for those colors we are not using */
            for (i = 0; i < num_palette; i++)
            {
               if ((int)png_ptr->quantize_index[i] >= maximum_colors)
               {
                  int min_d, k, min_k, d_index;

                  /* Find the closest color to one we threw out */
                  d_index = png_ptr->quantize_index[i];
                  min_d = PNG_COLOR_DIST(palette[d_index], palette[0]);
                  for (k = 1, min_k = 0; k < maximum_colors; k++)
                  {
                     int d;

                     d = PNG_COLOR_DIST(palette[d_index], palette[k]);

                     if (d < min_d)
                     {
                        min_d = d;
                        min_k = k;
                     }
                  }
                  /* Point to closest color */
                  png_ptr->quantize_index[i] = (png_byte)min_k;
               }
            }
         }
         png_free(png_ptr, png_ptr->quantize_sort);
         png_ptr->quantize_sort = NULL;
      }
      else
      {
         /* This is much harder to do simply (and quickly).  Perhaps
          * we need to go through a median cut routine, but those
          * don't always behave themselves with only a few colors
          * as input.  So we will just find the closest two colors,
          * and throw out one of them (chosen somewhat randomly).
          * [We don't understand this at all, so if someone wants to
          *  work on improving it, be our guest - AED, GRP]
          */
         int i;
         int max_d;
         int num_new_palette;
         png_dsortp t;
         png_dsortpp hash;

         t = NULL;

         /* Initialize palette index arrays */
         png_ptr->index_to_palette = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));
         png_ptr->palette_to_index = (png_bytep)png_malloc(png_ptr,
             (png_uint_32)((png_uint_32)num_palette * (sizeof (png_byte))));

         /* Initialize the sort array */
         for (i = 0; i < num_palette; i++)
         {
            png_ptr->index_to_palette[i] = (png_byte)i;
            png_ptr->palette_to_index[i] = (png_byte)i;
         }

         hash = (png_dsortpp)png_calloc(png_ptr, (png_uint_32)(769 *
             (sizeof (png_dsortp))));

         num_new_palette = num_palette;

         /* Initial wild guess at how far apart the farthest pixel
          * pair we will be eliminating will be.  Larger
          * numbers mean more areas will be allocated, Smaller
          * numbers run the risk of not saving enough data, and
          * having to do this all over again.
          *
          * I have not done extensive checking on this number.
          */
         max_d = 96;

         while (num_new_palette > maximum_colors)
         {
            for (i = 0; i < num_new_palette - 1; i++)
            {
               int j;

               for (j = i + 1; j < num_new_palette; j++)
               {
                  int d;

                  d = PNG_COLOR_DIST(palette[i], palette[j]);

                  if (d <= max_d)
                  {

                     t = (png_dsortp)png_malloc_warn(png_ptr,
                         (png_uint_32)(sizeof (png_dsort)));

                     if (t == NULL)
                         break;

                     t->next = hash[d];
                     t->left = (png_byte)i;
                     t->right = (png_byte)j;
                     hash[d] = t;
                  }
               }
               if (t == NULL)
                  break;
            }

            if (t != NULL)
            for (i = 0; i <= max_d; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p;

                  for (p = hash[i]; p; p = p->next)
                  {
                     if ((int)png_ptr->index_to_palette[p->left]
                         < num_new_palette &&
                         (int)png_ptr->index_to_palette[p->right]
                         < num_new_palette)
                     {
                        int j, next_j;

                        if (num_new_palette & 0x01)
                        {
                           j = p->left;
                           next_j = p->right;
                        }
                        else
                        {
                           j = p->right;
                           next_j = p->left;
                        }

                        num_new_palette--;
                        palette[png_ptr->index_to_palette[j]]
                            = palette[num_new_palette];
                        if (full_quantize == 0)
                        {
                           int k;

                           for (k = 0; k < num_palette; k++)
                           {
                              if (png_ptr->quantize_index[k] ==
                                  png_ptr->index_to_palette[j])
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[next_j];

                              if ((int)png_ptr->quantize_index[k] ==
                                  num_new_palette)
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[j];
                           }
                        }

                        png_ptr->index_to_palette[png_ptr->palette_to_index
                            [num_new_palette]] = png_ptr->index_to_palette[j];

                        png_ptr->palette_to_index[png_ptr->index_to_palette[j]]
                            = png_ptr->palette_to_index[num_new_palette];

                        png_ptr->index_to_palette[j] =
                            (png_byte)num_new_palette;

                        png_ptr->palette_to_index[num_new_palette] =
                            (png_byte)j;
                     }
                     if (num_new_palette <= maximum_colors)
                        break;
                  }
                  if (num_new_palette <= maximum_colors)
                     break;
               }
            }

            for (i = 0; i < 769; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p = hash[i];
                  while (p)
                  {
                     t = p->next;
                     png_free(png_ptr, p);
                     p = t;
                  }
               }
               hash[i] = 0;
            }
            max_d += 96;
         }
         png_free(png_ptr, hash);
         png_free(png_ptr, png_ptr->palette_to_index);
         png_free(png_ptr, png_ptr->index_to_palette);
         png_ptr->palette_to_index = NULL;
         png_ptr->index_to_palette = NULL;
      }
      num_palette = maximum_colors;
   }
   if (png_ptr->palette == NULL)
   {
      png_ptr->palette = palette;
   }
   png_ptr->num_palette = (png_uint_16)num_palette;

   if (full_quantize != 0)
   {
      int i;
      png_bytep distance;
      int total_bits = PNG_QUANTIZE_RED_BITS + PNG_QUANTIZE_GREEN_BITS +
          PNG_QUANTIZE_BLUE_BITS;
      int num_red = (1 << PNG_QUANTIZE_RED_BITS);
      int num_green = (1 << PNG_QUANTIZE_GREEN_BITS);
      int num_blue = (1 << PNG_QUANTIZE_BLUE_BITS);
      png_size_t num_entries = ((png_size_t)1 << total_bits);

      png_ptr->palette_lookup = (png_bytep)png_calloc(png_ptr,
          (png_uint_32)(num_entries * (sizeof (png_byte))));

      distance = (png_bytep)png_malloc(png_ptr, (png_uint_32)(num_entries *
          (sizeof (png_byte))));

      memset(distance, 0xff, num_entries * (sizeof (png_byte)));

      for (i = 0; i < num_palette; i++)
      {
         int ir, ig, ib;
         int r = (palette[i].red >> (8 - PNG_QUANTIZE_RED_BITS));
         int g = (palette[i].green >> (8 - PNG_QUANTIZE_GREEN_BITS));
         int b = (palette[i].blue >> (8 - PNG_QUANTIZE_BLUE_BITS));

         for (ir = 0; ir < num_red; ir++)
         {
            /* int dr = abs(ir - r); */
            int dr = ((ir > r) ? ir - r : r - ir);
            int index_r = (ir << (PNG_QUANTIZE_BLUE_BITS +
                PNG_QUANTIZE_GREEN_BITS));

            for (ig = 0; ig < num_green; ig++)
            {
               /* int dg = abs(ig - g); */
               int dg = ((ig > g) ? ig - g : g - ig);
               int dt = dr + dg;
               int dm = ((dr > dg) ? dr : dg);
               int index_g = index_r | (ig << PNG_QUANTIZE_BLUE_BITS);

               for (ib = 0; ib < num_blue; ib++)
               {
                  int d_index = index_g | ib;
                  /* int db = abs(ib - b); */
                  int db = ((ib > b) ? ib - b : b - ib);
                  int dmax = ((dm > db) ? dm : db);
                  int d = dmax + dt + db;

                  if (d < (int)distance[d_index])
                  {
                     distance[d_index] = (png_byte)d;
                     png_ptr->palette_lookup[d_index] = (png_byte)i;
                  }
               }
            }
         }
      }

      png_free(png_ptr, distance);
   }
}